

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::prepareCompresedTexture
          (TextureCubeMapArraySamplingTest *this,textureDefinition *texture,formatDefinition *format
          ,resolutionDefinition *resolution,bool mutability)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  compressedImage *pcVar7;
  InternalError *this_00;
  socklen_t __len;
  GLuint GVar8;
  resolutionDefinition *prVar9;
  sockaddr *__addr;
  uint uVar10;
  ulong uVar11;
  GLubyte *pGVar12;
  uint uVar13;
  bool bVar14;
  long lVar6;
  
  uVar1 = resolution->m_depth;
  uVar13 = resolution->m_height;
  if ((int)resolution->m_height < (int)resolution->m_width) {
    uVar13 = resolution->m_width;
  }
  uVar10 = 1;
  prVar9 = resolution;
  if (1 < (int)uVar13) {
    prVar9 = (resolutionDefinition *)(ulong)uVar13;
    do {
      prVar9 = (resolutionDefinition *)((ulong)prVar9 >> 1);
      uVar10 = uVar10 + 1;
      bVar14 = 3 < uVar13;
      uVar13 = (uint)prVar9;
    } while (bVar14);
  }
  __len = (socklen_t)prVar9;
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  textureDefinition::bind(texture,0x9009,__addr,__len);
  if (mutability) {
    if (uVar10 != 0) {
      GVar5 = resolution->m_width;
      GVar8 = resolution->m_height;
      uVar13 = 0;
      do {
        uVar11 = 0;
        pcVar7 = compressed_images;
        bVar14 = false;
        do {
          if (((pcVar7->width == resolution->m_width) && (pcVar7->height == resolution->m_height))
             && ((pcVar7->length == uVar1 / 6 && (pcVar7->level == uVar13)))) {
            if (!bVar14) {
              pGVar12 = pcVar7->image_data;
              uVar3 = pcVar7->image_size;
              goto LAB_00d7b2ce;
            }
            break;
          }
          bVar14 = 6 < uVar11;
          uVar11 = uVar11 + 1;
          pcVar7 = pcVar7 + 1;
        } while (uVar11 != 8);
        pGVar12 = (GLubyte *)0x0;
        uVar3 = 0;
LAB_00d7b2ce:
        if (pGVar12 == (GLubyte *)0x0) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_00,"Invalid compressed texture",fixed_sample_locations_values + 1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                     ,0xd65);
LAB_00d7b55c:
          __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        (**(code **)(lVar6 + 0x290))
                  (0x9009,uVar13,(format->m_source).m_internal_format,GVar5,GVar8,
                   resolution->m_depth,0,uVar3,pGVar12);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"compressedTexImage3D",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                        ,0xd6c);
        GVar5 = (int)GVar5 / 2;
        if ((int)GVar5 < 2) {
          GVar5 = 1;
        }
        GVar8 = (int)GVar8 / 2;
        if ((int)GVar8 < 2) {
          GVar8 = 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar10);
    }
  }
  else {
    (**(code **)(lVar6 + 0x1398))
              (0x9009,uVar10,(format->m_source).m_internal_format,resolution->m_width,
               resolution->m_height,resolution->m_depth);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"texStorage3D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0xd38);
    if (uVar10 != 0) {
      GVar5 = resolution->m_width;
      GVar8 = resolution->m_height;
      uVar13 = 0;
      do {
        uVar11 = 0;
        pcVar7 = compressed_images;
        bVar14 = false;
        do {
          if ((((pcVar7->width == resolution->m_width) && (pcVar7->height == resolution->m_height))
              && (pcVar7->length == uVar1 / 6)) && (pcVar7->level == uVar13)) {
            if (!bVar14) {
              pGVar12 = pcVar7->image_data;
              uVar3 = pcVar7->image_size;
              goto LAB_00d7b429;
            }
            break;
          }
          bVar14 = 6 < uVar11;
          uVar11 = uVar11 + 1;
          pcVar7 = pcVar7 + 1;
        } while (uVar11 != 8);
        pGVar12 = (GLubyte *)0x0;
        uVar3 = 0;
LAB_00d7b429:
        if (pGVar12 == (GLubyte *)0x0) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_00,"Invalid compressed texture",fixed_sample_locations_values + 1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                     ,0xd47);
          goto LAB_00d7b55c;
        }
        (**(code **)(lVar6 + 0x2b0))
                  (0x9009,uVar13,0,0,0,GVar5,GVar8,resolution->m_depth,
                   (format->m_source).m_internal_format,uVar3,pGVar12);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"compressedTexSubImage3D",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                        ,0xd50);
        GVar5 = (int)GVar5 / 2;
        if ((int)GVar5 < 2) {
          GVar5 = 1;
        }
        GVar8 = (int)GVar8 / 2;
        if ((int)GVar8 < 2) {
          GVar8 = 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar10);
    }
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::prepareCompresedTexture(const textureDefinition&	texture,
															  const formatDefinition&	 format,
															  const resolutionDefinition& resolution, bool mutability)
{
	static const glw::GLint n_faces = 6;

	const glw::GLint array_length	= resolution.m_depth / n_faces;
	const glw::GLint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	glw::GLsizei	 texture_width   = 0;
	glw::GLsizei	 texture_height  = 0;

	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	texture.bind(GL_TEXTURE_CUBE_MAP_ARRAY);

	if (false == mutability)
	{
		gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, n_mipmap_levels, format.m_source.m_internal_format,
						resolution.m_width, resolution.m_height, resolution.m_depth);

		GLU_EXPECT_NO_ERROR(gl.getError(), "texStorage3D");

		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, 0, /* x_offset */
									   0,										   /* y offset */
									   0,										   /* z offset */
									   texture_width, texture_height, resolution.m_depth,
									   format.m_source.m_internal_format, image_size, image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexSubImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
	else
	{
		texture_width  = resolution.m_width;
		texture_height = resolution.m_height;

		for (glw::GLint mipmap_level = 0; mipmap_level < n_mipmap_levels; ++mipmap_level)
		{
			const glw::GLubyte* image_data = 0;
			glw::GLuint			image_size = 0;

			getCompressedTexture(resolution.m_width, resolution.m_height, array_length, mipmap_level, image_data,
								 image_size);

			if (0 == image_data)
			{
				throw tcu::InternalError("Invalid compressed texture", "", __FILE__, __LINE__);
			}

			gl.compressedTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, format.m_source.m_internal_format,
									texture_width, texture_height, resolution.m_depth, 0 /* border */, image_size,
									image_data);

			GLU_EXPECT_NO_ERROR(gl.getError(), "compressedTexImage3D");

			texture_width  = de::max(1, texture_width / 2);
			texture_height = de::max(1, texture_height / 2);
		}
	}
}